

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::initCost(HModel *this,int perturb)

{
  uint uVar1;
  uint uVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  int i;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  initPh2ColCost(this,0,this->numCol + -1);
  initPh2RowCost(this,0,this->numRow + -1);
  this->problemPerturbed = 0;
  if ((perturb != 0) && (this->intOption[5] != 0)) {
    this->problemPerturbed = 1;
    uVar9 = 0;
    uVar7 = (ulong)(uint)this->numCol;
    if (this->numCol < 1) {
      uVar7 = uVar9;
    }
    dVar10 = 0.0;
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      dVar11 = ABS((this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9]);
      if (dVar11 <= dVar10) {
        dVar11 = dVar10;
      }
      dVar10 = dVar11;
    }
    if (100.0 < dVar10) {
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
    }
    uVar1 = this->numTot;
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    dVar11 = 0.0;
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      dVar11 = dVar11 + (double)(-(ulong)((this->workRange).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start[uVar7] < 1e+30) &
                                0x3ff0000000000000);
    }
    dVar12 = 5e-07;
    if (0.01 <= dVar11 / (double)(int)uVar1 || dVar10 <= 1.0) {
      dVar12 = dVar10 * 5e-07;
    }
    uVar2 = this->numCol;
    lVar8 = (long)(int)uVar2;
    pdVar3 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->dblXpert).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      dVar10 = pdVar3[uVar7];
      dVar11 = pdVar4[uVar7];
      dVar13 = pdVar5[uVar7];
      if ((((dVar10 != -1e+200) || (NAN(dVar10))) || (dVar11 != 1e+200)) || (NAN(dVar11))) {
        dVar14 = (ABS(dVar13) + 1.0) * dVar12 * (pdVar6[uVar7] + 1.0);
        if ((dVar11 != 1e+200) || (NAN(dVar11))) {
          if ((dVar10 != -1e+200) || (NAN(dVar10))) {
            if ((dVar10 == dVar11) && (!NAN(dVar10) && !NAN(dVar11))) goto LAB_0012e810;
            dVar13 = dVar13 + (double)(~-(ulong)(0.0 <= dVar13) & (ulong)-dVar14 |
                                      -(ulong)(0.0 <= dVar13) & (ulong)dVar14);
          }
          else {
            dVar13 = dVar13 - dVar14;
          }
        }
        else {
          dVar13 = dVar13 + dVar14;
        }
        pdVar5[uVar7] = dVar13;
      }
LAB_0012e810:
    }
    pdVar3 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->dblXpert).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (; lVar8 < (int)uVar1; lVar8 = lVar8 + 1) {
      pdVar3[lVar8] = (0.5 - pdVar4[lVar8]) * 1e-12 + pdVar3[lVar8];
    }
  }
  return;
}

Assistant:

void HModel::initCost(int perturb) {
  // Copy the cost
  initPh2ColCost(0, numCol-1);
  initPh2RowCost(0, numRow-1);
  // See if we want to skip perturbation
  problemPerturbed = 0;
  if (perturb == 0 || intOption[INTOPT_PERTURB_FLAG] == 0) return;
  problemPerturbed = 1;

  // Perturb the original costs, scale down if is too big
  double bigc = 0;
  for (int i = 0; i < numCol; i++)
    bigc = max(bigc, fabs(workCost[i]));
  if (bigc > 100)
    bigc = sqrt(sqrt(bigc));
  
  // If there's few boxed variables, we will just use Simple perturbation
  double boxedRate = 0;
  for (int i = 0; i < numTot; i++)
    boxedRate += (workRange[i] < 1e30);
  boxedRate /= numTot;
  if (boxedRate < 0.01)
    bigc = min(bigc, 1.0);
  if (bigc < 1) {
    //        bigc = sqrt(bigc);
  }
  
  // Determine the perturbation base
  double base = 5e-7 * bigc;
  
  // Now do the perturbation
  for (int i = 0; i < numCol; i++) {
    double lower = colLower[i];
    double upper = colUpper[i];
    double xpert = (fabs(workCost[i]) + 1) * base * (1 + dblXpert[i]);
    if (lower == -HSOL_CONST_INF && upper == HSOL_CONST_INF) {
      // Free - no perturb
    } else if (upper == HSOL_CONST_INF) {  // Lower
      workCost[i] += xpert;
    } else if (lower == -HSOL_CONST_INF) { // Upper
      workCost[i] += -xpert;
    } else if (lower != upper) {  // Boxed
      workCost[i] += (workCost[i] >= 0) ? xpert : -xpert;
    } else {
      // Fixed - no perturb
    }
  }
  
  for (int i = numCol; i < numTot; i++) {
    workCost[i] += (0.5 - dblXpert[i]) * 1e-12;
  }
  
}